

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

seed_t lest::seed(text *opt,text *arg)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  text local_70;
  text local_40;
  text *local_20;
  text *arg_local;
  text *opt_local;
  
  local_20 = arg;
  arg_local = opt;
  bVar1 = std::operator==(arg,"time");
  if (bVar1) {
    opt_local = (text *)time((time_t *)0x0);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)arg);
    bVar1 = is_number(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_f0,"expecting \'time\' or positive number with option \'",opt);
      std::operator+(&local_d0,&local_f0,"\', got \'");
      std::operator+(&local_b0,&local_d0,arg);
      std::operator+(&local_90,&local_b0,"\' (try option --help)");
      std::runtime_error::runtime_error(this,(string *)&local_90);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_70,(string *)arg);
    iVar2 = stoi(&local_70);
    opt_local = (text *)(long)iVar2;
    std::__cxx11::string::~string((string *)&local_70);
  }
  return (seed_t)opt_local;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}